

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::assign(QByteArray *this,QByteArrayView v)

{
  Data *pDVar1;
  QArrayData *data;
  qsizetype qVar2;
  char *pcVar3;
  size_t __n;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  __n = v.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) || ((pDVar1->super_QArrayData).alloc < (long)__n)) ||
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
    QByteArray(&local_38,v.m_data,__n);
    data = &((this->d).d)->super_QArrayData;
    pcVar4 = (this->d).ptr;
    (this->d).d = local_38.d.d;
    (this->d).ptr = local_38.d.ptr;
    qVar2 = (this->d).size;
    (this->d).size = local_38.d.size;
    local_38.d.d = (Data *)data;
    local_38.d.ptr = pcVar4;
    local_38.d.size = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
  }
  else {
    pcVar4 = (this->d).ptr;
    pcVar3 = (char *)((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
    if (pcVar3 != pcVar4) {
      (this->d).ptr = pcVar3;
      pcVar4 = pcVar3;
    }
    memcpy(pcVar4,v.m_data,__n);
    (this->d).size = __n;
    (this->d).ptr[__n] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::assign(QByteArrayView v)
{
    const auto len = v.size();

    if (len <= capacity() &&  isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        std::memcpy(d.begin(), v.data(), len);
        d.size = len;
        d.data()[d.size] = '\0';
    } else {
        *this = v.toByteArray();
    }
    return *this;
}